

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist_tests.cpp
# Opt level: O1

void __thiscall skiplist_tests::skiplist_test::test_method(skiplist_test *this)

{
  uint uVar1;
  CBlockIndex *__s;
  long lVar2;
  CBlockIndex *pCVar3;
  CBlockIndex *pCVar4;
  iterator in_R8;
  iterator pvVar5;
  iterator in_R9;
  iterator pvVar6;
  long lVar7;
  CBlockIndex **ppCVar8;
  uint height;
  CBlockIndex *unaff_R13;
  FastRandomContext *this_00;
  int iVar9;
  CBlockIndex *pCVar10;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  check_type cVar11;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  lazy_ostream local_90;
  undefined1 *local_80;
  char **local_78;
  assertion_result local_70;
  undefined1 *local_58;
  undefined1 *local_50;
  char *local_48;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __s = (CBlockIndex *)operator_new(45600000);
  iVar9 = 0;
  memset(__s,0,45600000);
  lVar7 = 0;
  do {
    *(int *)((long)(__s->nChainWork).super_base_uint<256U>.pn + lVar7 + -0x10) = iVar9;
    lVar2 = (long)__s[-1].nChainWork.super_base_uint<256U>.pn + lVar7 + -0x28;
    if (lVar7 == 0) {
      lVar2 = 0;
    }
    *(long *)((long)(&__s->nChainWork + -1) + lVar7) = lVar2;
    CBlockIndex::BuildSkip
              ((CBlockIndex *)((long)(__s->nChainWork).super_base_uint<256U>.pn + lVar7 + -0x28));
    lVar7 = lVar7 + 0x98;
    iVar9 = iVar9 + 1;
  } while (lVar7 != 45600000);
  ppCVar8 = &__s->pskip;
  lVar7 = 0;
  do {
    if (lVar7 == 0) {
      local_f0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
      ;
      local_e8 = "";
      local_100 = &boost::unit_test::basic_cstring<char_const>::null;
      local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_01.m_end = (iterator)0x20;
      file_01.m_begin = (iterator)&local_f0;
      msg_01.m_end = in_R9;
      msg_01.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_100,
                 msg_01);
      local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(*ppCVar8 == (CBlockIndex *)0x0);
      local_70.m_message.px = (element_type *)0x0;
      local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_a0 = "vIndex[i].pskip == nullptr";
      local_98 = "";
      local_90.m_empty = false;
      local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
      local_80 = boost::unit_test::lazy_ostream::inst;
      local_78 = &local_a0;
      local_110 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
      ;
      local_108 = "";
      in_R8 = (iterator)0x1;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_70,&local_90,1,0,WARN,_cVar11,(size_t)&local_110,0x20);
    }
    else {
      local_48 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
      ;
      unaff_R13 = (CBlockIndex *)0xf3e43d;
      local_40 = "";
      local_58 = &boost::unit_test::basic_cstring<char_const>::null;
      local_50 = &boost::unit_test::basic_cstring<char_const>::null;
      file.m_end = (iterator)0x1d;
      file.m_begin = (iterator)&local_48;
      msg.m_end = in_R9;
      msg.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_58,msg);
      local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(*ppCVar8 == __s + (*ppCVar8)->nHeight);
      local_70.m_message.px = (element_type *)0x0;
      local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_a0 = "vIndex[i].pskip == &vIndex[vIndex[i].pskip->nHeight]";
      local_98 = "";
      local_90.m_empty = false;
      local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
      local_80 = boost::unit_test::lazy_ostream::inst;
      local_78 = &local_a0;
      local_b0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
      ;
      local_a8 = "";
      pvVar5 = (iterator)0x1;
      pvVar6 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_70,&local_90,1,0,WARN,_cVar11,(size_t)&local_b0,0x1d);
      boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
      local_c0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
      ;
      local_b8 = "";
      local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_00.m_end = (iterator)0x1e;
      file_00.m_begin = (iterator)&local_c0;
      msg_00.m_end = pvVar6;
      msg_00.m_begin = pvVar5;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_d0,
                 msg_00);
      local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)((*ppCVar8)->nHeight < lVar7);
      local_70.m_message.px = (element_type *)0x0;
      local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_a0 = "vIndex[i].pskip->nHeight < i";
      local_98 = "";
      local_90.m_empty = false;
      local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
      local_80 = boost::unit_test::lazy_ostream::inst;
      local_78 = &local_a0;
      local_e0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
      ;
      local_d8 = "";
      in_R8 = (iterator)0x1;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_70,&local_90,1,0,WARN,_cVar11,(size_t)&local_e0,0x1e);
    }
    boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
    lVar7 = lVar7 + 1;
    ppCVar8 = ppCVar8 + 0x13;
  } while (lVar7 != 300000);
  this_00 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng;
  iVar9 = 0;
  pCVar10 = (CBlockIndex *)0x493e0;
  do {
    do {
      pCVar3 = (CBlockIndex *)
               RandomMixin<FastRandomContext>::randbits
                         (&this_00->super_RandomMixin<FastRandomContext>,0x13);
      pCVar4 = unaff_R13;
      if ((CBlockIndex *)0x493de >= pCVar3) {
        pCVar4 = pCVar3;
      }
      unaff_R13 = (CBlockIndex *)((ulong)pCVar4 & 0xffffffff);
    } while ((CBlockIndex *)0x493de < pCVar3);
    height = (uint)pCVar4;
    if (height == 0) {
      uVar1 = 0x20;
    }
    else {
      uVar1 = 0x1f;
      if (height != 0) {
        for (; height >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      uVar1 = uVar1 ^ 0x1f;
    }
    do {
      pCVar3 = (CBlockIndex *)
               RandomMixin<FastRandomContext>::randbits
                         (&this_00->super_RandomMixin<FastRandomContext>,0x20 - uVar1);
      pCVar4 = pCVar10;
      if (pCVar3 <= unaff_R13) {
        pCVar4 = pCVar3;
      }
      pCVar10 = (CBlockIndex *)((ulong)pCVar4 & 0xffffffff);
    } while (unaff_R13 < pCVar3);
    local_120 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_118 = "";
    local_130 = &boost::unit_test::basic_cstring<char_const>::null;
    local_128 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = &DAT_00000028;
    file_02.m_begin = (iterator)&local_120;
    msg_02.m_end = in_R9;
    msg_02.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_130,
               msg_02);
    pCVar10 = CBlockIndex::GetAncestor(__s + 299999,height);
    unaff_R13 = __s + (int)height;
    local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(pCVar10 == unaff_R13);
    local_70.m_message.px = (element_type *)0x0;
    local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_a0 = "vIndex[300000 - 1].GetAncestor(from) == &vIndex[from]";
    local_98 = "";
    local_90.m_empty = false;
    local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
    local_80 = boost::unit_test::lazy_ostream::inst;
    local_78 = &local_a0;
    local_140 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_138 = "";
    pvVar5 = (iterator)0x1;
    pvVar6 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_70,&local_90,1,0,WARN,_cVar11,(size_t)&local_140,0x28);
    boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
    local_150 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_148 = "";
    local_160 = &boost::unit_test::basic_cstring<char_const>::null;
    local_158 = &boost::unit_test::basic_cstring<char_const>::null;
    file_03.m_end = (iterator)0x29;
    file_03.m_begin = (iterator)&local_150;
    msg_03.m_end = pvVar6;
    msg_03.m_begin = pvVar5;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_160,
               msg_03);
    pCVar10 = CBlockIndex::GetAncestor(unaff_R13,(int)pCVar4);
    local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(pCVar10 == __s + (int)pCVar4);
    local_70.m_message.px = (element_type *)0x0;
    local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_a0 = "vIndex[from].GetAncestor(to) == &vIndex[to]";
    local_98 = "";
    local_90.m_empty = false;
    local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
    local_80 = boost::unit_test::lazy_ostream::inst;
    local_78 = &local_a0;
    local_170 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    pCVar10 = (CBlockIndex *)0xf3e43d;
    local_168 = "";
    pvVar5 = (iterator)0x1;
    pvVar6 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_70,&local_90,1,0,WARN,_cVar11,(size_t)&local_170,0x29);
    boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
    local_180 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_178 = "";
    local_190 = &boost::unit_test::basic_cstring<char_const>::null;
    local_188 = &boost::unit_test::basic_cstring<char_const>::null;
    file_04.m_end = (iterator)0x2a;
    file_04.m_begin = (iterator)&local_180;
    msg_04.m_end = pvVar6;
    msg_04.m_begin = pvVar5;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_190,
               msg_04);
    pCVar4 = CBlockIndex::GetAncestor(unaff_R13,0);
    local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(pCVar4 == __s);
    local_70.m_message.px = (element_type *)0x0;
    local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_a0 = "vIndex[from].GetAncestor(0) == vIndex.data()";
    local_98 = "";
    local_90.m_empty = false;
    local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
    local_80 = boost::unit_test::lazy_ostream::inst;
    local_78 = &local_a0;
    local_1a0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
    ;
    local_198 = "";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_70,&local_90,1,0,WARN,_cVar11,(size_t)&local_1a0,0x2a);
    boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
    iVar9 = iVar9 + 1;
  } while (iVar9 != 1000);
  operator_delete(__s,45600000);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(skiplist_test)
{
    std::vector<CBlockIndex> vIndex(SKIPLIST_LENGTH);

    for (int i=0; i<SKIPLIST_LENGTH; i++) {
        vIndex[i].nHeight = i;
        vIndex[i].pprev = (i == 0) ? nullptr : &vIndex[i - 1];
        vIndex[i].BuildSkip();
    }

    for (int i=0; i<SKIPLIST_LENGTH; i++) {
        if (i > 0) {
            BOOST_CHECK(vIndex[i].pskip == &vIndex[vIndex[i].pskip->nHeight]);
            BOOST_CHECK(vIndex[i].pskip->nHeight < i);
        } else {
            BOOST_CHECK(vIndex[i].pskip == nullptr);
        }
    }

    for (int i=0; i < 1000; i++) {
        int from = m_rng.randrange(SKIPLIST_LENGTH - 1);
        int to = m_rng.randrange(from + 1);

        BOOST_CHECK(vIndex[SKIPLIST_LENGTH - 1].GetAncestor(from) == &vIndex[from]);
        BOOST_CHECK(vIndex[from].GetAncestor(to) == &vIndex[to]);
        BOOST_CHECK(vIndex[from].GetAncestor(0) == vIndex.data());
    }
}